

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rust.cpp
# Opt level: O0

int test_rust_dummy(ITesting *t)

{
  ITesting *t_local;
  
  printf("test_rust_dummy - Hello from C\n");
  printf("ITesting size=%zu\n",0x60);
  printf("t = %p\n",t);
  printf("t->Debug = %p\n",t->Debug);
  printf("AssertError: =  %p\n",t->AssertError);
  HexDumpToConsole(t,0x60);
  return 0;
}

Assistant:

DLL_EXPORT int test_rust_dummy(ITesting *t) {
    printf("test_rust_dummy - Hello from C\n");
    printf("ITesting size=%zu\n",sizeof(ITesting));
    printf("t = %p\n", (void *)t);
    printf("t->Debug = %p\n", (void *)t->Debug);
    printf("AssertError: =  %p\n", (void *)t->AssertError);
    HexDumpToConsole(t, sizeof(ITesting));
    return kTR_Pass;
}